

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall Search::predictor::erase_alloweds(predictor *this)

{
  uint *puVar1;
  uint **ppuVar2;
  float **ppfVar3;
  predictor *in_RDI;
  v_array<float> *in_stack_ffffffffffffffe0;
  float *pfVar4;
  
  if ((in_RDI->allowed_is_pointer & 1U) == 0) {
    v_array<unsigned_int>::clear((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  }
  else {
    ppuVar2 = v_array<unsigned_int>::begin(&in_RDI->allowed_actions);
    puVar1 = *ppuVar2;
    ppuVar2 = v_array<unsigned_int>::end(&in_RDI->allowed_actions);
    *ppuVar2 = puVar1;
  }
  if ((in_RDI->allowed_cost_is_pointer & 1U) == 0) {
    v_array<float>::clear(in_stack_ffffffffffffffe0);
  }
  else {
    ppfVar3 = v_array<float>::begin(&in_RDI->allowed_actions_cost);
    pfVar4 = *ppfVar3;
    ppfVar3 = v_array<float>::end(&in_RDI->allowed_actions_cost);
    *ppfVar3 = pfVar4;
  }
  return in_RDI;
}

Assistant:

predictor& predictor::erase_alloweds()
{
  if (allowed_is_pointer)
    allowed_actions.end() = allowed_actions.begin();
  else
    allowed_actions.clear();
  if (allowed_cost_is_pointer)
    allowed_actions_cost.end() = allowed_actions_cost.begin();
  else
    allowed_actions_cost.clear();
  return *this;
}